

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTestsNamesOnly(Config *config)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_01;
  ostream *poVar4;
  size_t sVar5;
  undefined8 *puVar6;
  TestSpec testSpec;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_110;
  string local_f8;
  undefined8 *local_d8;
  undefined8 *puStack_d0;
  size_t local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pointer local_a0;
  pointer pPStack_98;
  pointer local_90;
  pointer pFStack_88;
  pointer local_80;
  pointer pFStack_78;
  TagAliasRegistry *local_70;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_60;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_48;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_110,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    TagAliasRegistry::get();
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_a0 = (pointer)0x0;
    pPStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    pFStack_88 = (pointer)0x0;
    local_80 = (pointer)0x0;
    pFStack_78 = (pointer)0x0;
    local_70 = &TagAliasRegistry::get::instance;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_c0._M_p = (pointer)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"*","");
    this = TestSpecParser::parse((TestSpecParser *)&local_d8,&local_f8);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_60,&(this->m_testSpec).m_filters);
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_110.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_110.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_110.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_60.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_60.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_110.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_60.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_48);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &pFStack_88);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)&local_a0);
    if ((TestSpecParser *)local_c0._M_p != (TestSpecParser *)&local_b0) {
      operator_delete(local_c0._M_p);
    }
  }
  local_d8 = (undefined8 *)0x0;
  puStack_d0 = (undefined8 *)0x0;
  local_c8 = 0;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar2),&local_110,config,(TestSpecParser *)&local_d8);
  puVar1 = puStack_d0;
  sVar5 = 0;
  for (puVar6 = local_d8; puVar6 != puVar1; puVar6 = puVar6 + 0x23) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar6,puVar6[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    sVar5 = sVar5 + 1;
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&local_d8);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_110);
  return sVar5;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            std::cout << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }